

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::formatTruncated<StringLiteral>
               (ostream *out,StringLiteral *value,int ntrunc)

{
  StringLiteral *pSVar1;
  long lVar2;
  int local_1cc;
  string local_1c8 [8];
  string result;
  ostringstream local_198 [8];
  ostringstream tmp;
  int local_1c;
  StringLiteral *pSStack_18;
  int ntrunc_local;
  StringLiteral *value_local;
  ostream *out_local;
  
  local_1c = ntrunc;
  pSStack_18 = value;
  value_local = (StringLiteral *)out;
  std::__cxx11::ostringstream::ostringstream(local_198);
  ::operator<<((ostream *)local_198,pSStack_18);
  std::__cxx11::ostringstream::str();
  pSVar1 = value_local;
  lVar2 = std::__cxx11::string::c_str();
  local_1cc = std::__cxx11::string::size();
  std::min<int>(&local_1c,&local_1cc);
  std::ostream::write((char *)pSVar1,lVar2);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

inline void formatTruncated(std::ostream& out, const T& value, int ntrunc)
{
    std::ostringstream tmp;
    tmp << value;
    std::string result = tmp.str();
    out.write(result.c_str(), (std::min)(ntrunc, static_cast<int>(result.size())));
}